

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupAbsGates(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  Vec_Int_t *vFlops;
  Vec_Int_t *vNodes;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe2,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  if (vGateClasses->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe3,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  local_38 = vGateClasses;
  Gia_ManGlaCollect(p,vGateClasses,&local_40,&local_48,&local_58,&local_50);
  p_00 = Gia_ManStart(5000);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (0 < local_40->nSize) {
    lVar17 = 0;
    do {
      iVar1 = local_40->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_005f72bf;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_005f72bf;
      pGVar5[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_40->nSize);
  }
  if (0 < local_48->nSize) {
    lVar17 = 0;
    do {
      iVar1 = local_48->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_005f72bf;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_005f72bf;
      pGVar5[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_48->nSize);
  }
  if (0 < local_58->nSize) {
    lVar17 = 0;
    do {
      iVar1 = local_58->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_005f72bf:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_005f72bf;
      pGVar5[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_58->nSize);
  }
  if (0 < local_50->nSize) {
    lVar17 = 0;
    do {
      iVar1 = local_50->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar1;
      uVar16 = *(ulong *)pGVar5;
      if (((int)pGVar5[-(ulong)((uint)uVar16 & 0x1fffffff)].Value < 0) ||
         (uVar8 = (uint)(uVar16 >> 0x20), (int)pGVar5[-(ulong)(uVar8 & 0x1fffffff)].Value < 0))
      goto LAB_005f72fd;
      uVar8 = Gia_ManAppendAnd(p_00,(uint)(uVar16 >> 0x1d) & 1 ^
                                    pGVar5[-(ulong)((uint)uVar16 & 0x1fffffff)].Value,
                               pGVar5[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1);
      pGVar5->Value = uVar8;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_50->nSize);
  }
  pVVar12 = p->vCos;
  uVar16 = (ulong)(uint)pVVar12->nSize;
  if (p->nRegs < pVVar12->nSize) {
    lVar17 = 0;
    do {
      if ((int)uVar16 <= lVar17) goto LAB_005f731c;
      iVar1 = pVVar12->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar1;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0)
      goto LAB_005f72fd;
      uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                   pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value)
      ;
      pGVar5->Value = uVar8;
      lVar17 = lVar17 + 1;
      pVVar12 = p->vCos;
      uVar16 = (ulong)pVVar12->nSize;
    } while (lVar17 < (long)(uVar16 - (long)p->nRegs));
  }
  uVar8 = local_58->nSize;
  uVar16 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    lVar17 = 0;
    do {
      uVar8 = (uint)uVar16;
      iVar1 = local_58->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(undefined8 *)(pGVar5 + iVar1);
      if (((uint)uVar7 & 0x9fffffff) != 0x9fffffff) {
LAB_005f72de:
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar8 = (uint)((ulong)uVar7 >> 0x20) & 0x1fffffff;
      iVar2 = p->vCis->nSize;
      if ((int)uVar8 < iVar2 - p->nRegs) goto LAB_005f72de;
      iVar3 = p->vCos->nSize;
      uVar8 = (iVar3 - iVar2) + uVar8;
      if (((int)uVar8 < 0) || (iVar3 <= (int)uVar8)) {
LAB_005f731c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar8];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005f72a0;
      uVar15 = (uint)*(undefined8 *)(pGVar5 + iVar2);
      uVar8 = (pGVar5 + iVar2)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar8 < 0) {
LAB_005f72fd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar8 = Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar8);
      uVar7 = *(undefined8 *)(pGVar5 + iVar1);
      if (((uint)uVar7 & 0x9fffffff) != 0x9fffffff) goto LAB_005f72de;
      uVar15 = (uint)((ulong)uVar7 >> 0x20) & 0x1fffffff;
      iVar1 = p->vCis->nSize;
      if ((int)uVar15 < iVar1 - p->nRegs) goto LAB_005f72de;
      iVar2 = p->vCos->nSize;
      uVar15 = (iVar2 - iVar1) + uVar15;
      if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_005f731c;
      iVar1 = p->vCos->pArray[uVar15];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005f72a0;
      p->pObjs[iVar1].Value = uVar8;
      lVar17 = lVar17 + 1;
      uVar8 = local_58->nSize;
      uVar16 = (ulong)(int)uVar8;
    } while (lVar17 < (long)uVar16);
  }
  Gia_ManSetRegNum(p_00,uVar8);
  pGVar13 = Gia_ManSeqCleanup(p_00);
  if (((p_00->nObjs != pGVar13->nObjs) && (0 < p->nObjs)) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar14 = &p->pObjs->Value;
    lVar17 = 0;
    do {
      uVar8 = *puVar14;
      if (uVar8 != 0xffffffff) {
        if ((int)uVar8 < 0) {
LAB_005f733b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar8 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                        ,0x10d,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
        }
        if (p_00->nObjs <= (int)(uVar8 >> 1)) {
LAB_005f72a0:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar8 = p_00->pObjs[uVar8 >> 1].Value;
        if (uVar8 == 0xffffffff) {
          if (local_38->nSize <= lVar17) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          local_38->pArray[lVar17] = 0;
          uVar8 = 0xffffffff;
        }
        else {
          if ((int)uVar8 < 0) goto LAB_005f733b;
          if ((uVar8 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(pCopy->Value)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                          ,0x115,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
          }
        }
        *puVar14 = uVar8;
      }
      lVar17 = lVar17 + 1;
      puVar14 = puVar14 + 3;
    } while (lVar17 < p->nObjs);
  }
  Gia_ManStop(p_00);
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    local_40->pArray = (int *)0x0;
  }
  if (local_40 != (Vec_Int_t *)0x0) {
    free(local_40);
  }
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
    local_48->pArray = (int *)0x0;
  }
  if (local_48 != (Vec_Int_t *)0x0) {
    free(local_48);
  }
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
    local_58->pArray = (int *)0x0;
  }
  if (local_58 != (Vec_Int_t *)0x0) {
    free(local_58);
  }
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    local_50->pArray = (int *)0x0;
  }
  if (local_50 != (Vec_Int_t *)0x0) {
    free(local_50);
  }
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsGates( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{ 
    Vec_Int_t * vPis, * vPPis, * vFlops, * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pCopy;
    int i;//, nFlops = 0;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );

    // create additional arrays
    Gia_ManGlaCollect( p, vGateClasses, &vPis, &vPPis, &vFlops, &vNodes );

    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
//        Gia_ManDupAbsGates_rec( pNew, pObj );
    // create PO
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create RIs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        Gia_ObjRoToRi(p, pObj)->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ObjRoToRi(p, pObj)) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFlops) );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    // transfer copy values: (p -> pTemp -> pNew) => (p -> pNew)
    if ( Gia_ManObjNum(pTemp) != Gia_ManObjNum(pNew) )
    {
//        printf( "Gia_ManDupAbsGates() Internal error: object mismatch.\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            assert( !Abc_LitIsCompl(pObj->Value) );
            pCopy = Gia_ObjCopy( pTemp, pObj );
            if ( !~pCopy->Value )
            {
                Vec_IntWriteEntry( vGateClasses, i, 0 );
                pObj->Value = ~0;
                continue;
            }
            assert( !Abc_LitIsCompl(pCopy->Value) );
            pObj->Value = pCopy->Value;
        }
    }
    Gia_ManStop( pTemp );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vFlops );
    Vec_IntFree( vNodes );
    return pNew;
}